

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Triple.cpp
# Opt level: O0

EnvironmentType parseEnvironment(StringRef EnvironmentName)

{
  bool bVar1;
  EnvironmentType *pEVar2;
  StringLiteral local_8d8;
  StringLiteral local_8c8;
  StringLiteral local_8b8;
  StringLiteral local_8a8;
  StringLiteral local_898;
  StringLiteral local_888;
  StringLiteral local_878;
  StringLiteral local_868;
  StringLiteral local_858;
  StringLiteral local_848;
  StringLiteral local_838;
  StringLiteral local_828;
  StringLiteral local_818;
  StringLiteral local_808;
  StringLiteral local_7f8;
  StringLiteral local_7e8;
  StringLiteral local_7d8;
  StringLiteral local_7c8;
  char *local_7b8;
  char *local_7b0;
  char *local_7a8;
  char *local_7a0;
  Optional<llvm::Triple::EnvironmentType> OStack_798;
  char *local_790;
  StringRef EnvironmentName_local;
  EnvironmentType local_754;
  char **local_750;
  char *local_748;
  char *local_740;
  char **local_738;
  char *local_730;
  char *local_728;
  char *local_720;
  char *local_718;
  char *local_710;
  int local_704;
  char *local_700;
  char *local_6f8;
  EnvironmentType local_6ec;
  char **local_6e8;
  char *local_6e0;
  char *local_6d8;
  char **local_6d0;
  char *local_6c8;
  char *local_6c0;
  char *local_6b8;
  char *local_6b0;
  char *local_6a8;
  int local_69c;
  char *local_698;
  char *local_690;
  EnvironmentType local_684;
  char **local_680;
  char *local_678;
  char *local_670;
  char **local_668;
  char *local_660;
  char *local_658;
  char *local_650;
  char *local_648;
  char *local_640;
  int local_634;
  char *local_630;
  char *local_628;
  EnvironmentType local_61c;
  char **local_618;
  char *local_610;
  char *local_608;
  char **local_600;
  char *local_5f8;
  char *local_5f0;
  char *local_5e8;
  char *local_5e0;
  char *local_5d8;
  int local_5cc;
  char *local_5c8;
  char *local_5c0;
  EnvironmentType local_5b4;
  char **local_5b0;
  char *local_5a8;
  char *local_5a0;
  char **local_598;
  char *local_590;
  char *local_588;
  char *local_580;
  char *local_578;
  char *local_570;
  int local_564;
  char *local_560;
  char *local_558;
  EnvironmentType local_54c;
  char **local_548;
  char *local_540;
  char *local_538;
  char **local_530;
  char *local_528;
  char *local_520;
  char *local_518;
  char *local_510;
  char *local_508;
  int local_4fc;
  char *local_4f8;
  char *local_4f0;
  EnvironmentType local_4e4;
  char **local_4e0;
  char *local_4d8;
  char *local_4d0;
  char **local_4c8;
  char *local_4c0;
  char *local_4b8;
  char *local_4b0;
  char *local_4a8;
  char *local_4a0;
  int local_494;
  char *local_490;
  char *local_488;
  EnvironmentType local_47c;
  char **local_478;
  char *local_470;
  char *local_468;
  char **local_460;
  char *local_458;
  char *local_450;
  char *local_448;
  char *local_440;
  char *local_438;
  int local_42c;
  char *local_428;
  char *local_420;
  EnvironmentType local_414;
  char **local_410;
  char *local_408;
  char *local_400;
  char **local_3f8;
  char *local_3f0;
  char *local_3e8;
  char *local_3e0;
  char *local_3d8;
  char *local_3d0;
  int local_3c4;
  char *local_3c0;
  char *local_3b8;
  EnvironmentType local_3ac;
  char **local_3a8;
  char *local_3a0;
  char *local_398;
  char **local_390;
  char *local_388;
  char *local_380;
  char *local_378;
  char *local_370;
  char *local_368;
  int local_35c;
  char *local_358;
  char *local_350;
  EnvironmentType local_344;
  char **local_340;
  char *local_338;
  char *local_330;
  char **local_328;
  char *local_320;
  char *local_318;
  char *local_310;
  char *local_308;
  char *local_300;
  int local_2f4;
  char *local_2f0;
  char *local_2e8;
  EnvironmentType local_2dc;
  char **local_2d8;
  char *local_2d0;
  char *local_2c8;
  char **local_2c0;
  char *local_2b8;
  char *local_2b0;
  char *local_2a8;
  char *local_2a0;
  char *local_298;
  int local_28c;
  char *local_288;
  char *local_280;
  EnvironmentType local_274;
  char **local_270;
  char *local_268;
  char *local_260;
  char **local_258;
  char *local_250;
  char *local_248;
  char *local_240;
  char *local_238;
  char *local_230;
  int local_224;
  char *local_220;
  char *local_218;
  EnvironmentType local_20c;
  char **local_208;
  char *local_200;
  char *local_1f8;
  char **local_1f0;
  char *local_1e8;
  char *local_1e0;
  char *local_1d8;
  char *local_1d0;
  char *local_1c8;
  int local_1bc;
  char *local_1b8;
  char *local_1b0;
  EnvironmentType local_1a4;
  char **local_1a0;
  char *local_198;
  char *local_190;
  char **local_188;
  char *local_180;
  char *local_178;
  char *local_170;
  char *local_168;
  char *local_160;
  int local_154;
  char *local_150;
  char *local_148;
  EnvironmentType local_13c;
  char **local_138;
  char *local_130;
  char *local_128;
  char **local_120;
  char *local_118;
  char *local_110;
  char *local_108;
  char *local_100;
  char *local_f8;
  int local_ec;
  char *local_e8;
  char *local_e0;
  EnvironmentType local_d4;
  char **local_d0;
  char *local_c8;
  char *local_c0;
  char **local_b8;
  char *local_b0;
  char *local_a8;
  char *local_a0;
  char *local_98;
  char *local_90;
  int local_84;
  char *local_80;
  char *local_78;
  EnvironmentType local_6c;
  char **local_68;
  char *local_60;
  char *local_58;
  char **local_50;
  char *local_48;
  char *local_40;
  char *local_38;
  char *local_30;
  char *local_28;
  int local_20;
  EnvironmentType local_1c;
  char **local_18;
  EnvironmentType local_c;
  
  local_7b0 = (char *)EnvironmentName.Length;
  local_7b8 = EnvironmentName.Data;
  EnvironmentName_local.Length = (size_t)&local_7a8;
  local_790 = local_7b8;
  EnvironmentName_local.Data = local_7b0;
  local_7a8 = local_7b8;
  local_7a0 = local_7b0;
  llvm::Optional<llvm::Triple::EnvironmentType>::Optional(&OStack_798);
  llvm::StringLiteral::StringLiteral<7UL>(&local_7c8,(char (*) [7])0x35d6f9);
  local_60 = local_7c8.super_StringRef.Data;
  local_58 = (char *)local_7c8.super_StringRef.Length;
  local_6c = EABIHF;
  local_68 = &local_7a8;
  bVar1 = llvm::Optional::operator_cast_to_bool((Optional *)&OStack_798);
  if (!bVar1) {
    local_80 = local_60;
    local_78 = local_58;
    local_48 = local_60;
    local_40 = local_58;
    bVar1 = false;
    local_50 = &local_7a8;
    if (local_58 <= local_7a0) {
      local_28 = local_7a8;
      local_30 = local_60;
      local_38 = local_58;
      if (local_58 == (char *)0x0) {
        local_20 = 0;
      }
      else {
        local_20 = memcmp(local_7a8,local_60,(size_t)local_58);
      }
      bVar1 = local_20 == 0;
    }
    if (bVar1) {
      llvm::Optional<llvm::Triple::EnvironmentType>::operator=(&OStack_798,&local_6c);
    }
  }
  llvm::StringLiteral::StringLiteral<5UL>(&local_7d8,(char (*) [5])0x35d82c);
  local_c8 = local_7d8.super_StringRef.Data;
  local_c0 = (char *)local_7d8.super_StringRef.Length;
  local_d4 = EABI;
  local_d0 = &local_7a8;
  bVar1 = llvm::Optional::operator_cast_to_bool((Optional *)&OStack_798);
  if (!bVar1) {
    local_e8 = local_c8;
    local_e0 = local_c0;
    local_b0 = local_c8;
    local_a8 = local_c0;
    bVar1 = false;
    local_b8 = &local_7a8;
    if (local_c0 <= local_7a0) {
      local_90 = local_7a8;
      local_98 = local_c8;
      local_a0 = local_c0;
      if (local_c0 == (char *)0x0) {
        local_84 = 0;
      }
      else {
        local_84 = memcmp(local_7a8,local_c8,(size_t)local_c0);
      }
      bVar1 = local_84 == 0;
    }
    if (bVar1) {
      llvm::Optional<llvm::Triple::EnvironmentType>::operator=(&OStack_798,&local_d4);
    }
  }
  llvm::StringLiteral::StringLiteral<10UL>(&local_7e8,(char (*) [10])"gnuabin32");
  local_130 = local_7e8.super_StringRef.Data;
  local_128 = (char *)local_7e8.super_StringRef.Length;
  local_13c = GNUABIN32;
  local_138 = &local_7a8;
  bVar1 = llvm::Optional::operator_cast_to_bool((Optional *)&OStack_798);
  if (!bVar1) {
    local_150 = local_130;
    local_148 = local_128;
    local_118 = local_130;
    local_110 = local_128;
    bVar1 = false;
    local_120 = &local_7a8;
    if (local_128 <= local_7a0) {
      local_f8 = local_7a8;
      local_100 = local_130;
      local_108 = local_128;
      if (local_128 == (char *)0x0) {
        local_ec = 0;
      }
      else {
        local_ec = memcmp(local_7a8,local_130,(size_t)local_128);
      }
      bVar1 = local_ec == 0;
    }
    if (bVar1) {
      llvm::Optional<llvm::Triple::EnvironmentType>::operator=(&OStack_798,&local_13c);
    }
  }
  llvm::StringLiteral::StringLiteral<9UL>(&local_7f8,(char (*) [9])"gnuabi64");
  local_198 = local_7f8.super_StringRef.Data;
  local_190 = (char *)local_7f8.super_StringRef.Length;
  local_1a4 = GNUABI64;
  local_1a0 = &local_7a8;
  bVar1 = llvm::Optional::operator_cast_to_bool((Optional *)&OStack_798);
  if (!bVar1) {
    local_1b8 = local_198;
    local_1b0 = local_190;
    local_180 = local_198;
    local_178 = local_190;
    bVar1 = false;
    local_188 = &local_7a8;
    if (local_190 <= local_7a0) {
      local_160 = local_7a8;
      local_168 = local_198;
      local_170 = local_190;
      if (local_190 == (char *)0x0) {
        local_154 = 0;
      }
      else {
        local_154 = memcmp(local_7a8,local_198,(size_t)local_190);
      }
      bVar1 = local_154 == 0;
    }
    if (bVar1) {
      llvm::Optional<llvm::Triple::EnvironmentType>::operator=(&OStack_798,&local_1a4);
    }
  }
  llvm::StringLiteral::StringLiteral<10UL>(&local_808,(char (*) [10])"gnueabihf");
  local_200 = local_808.super_StringRef.Data;
  local_1f8 = (char *)local_808.super_StringRef.Length;
  local_20c = GNUEABIHF;
  local_208 = &local_7a8;
  bVar1 = llvm::Optional::operator_cast_to_bool((Optional *)&OStack_798);
  if (!bVar1) {
    local_220 = local_200;
    local_218 = local_1f8;
    local_1e8 = local_200;
    local_1e0 = local_1f8;
    bVar1 = false;
    local_1f0 = &local_7a8;
    if (local_1f8 <= local_7a0) {
      local_1c8 = local_7a8;
      local_1d0 = local_200;
      local_1d8 = local_1f8;
      if (local_1f8 == (char *)0x0) {
        local_1bc = 0;
      }
      else {
        local_1bc = memcmp(local_7a8,local_200,(size_t)local_1f8);
      }
      bVar1 = local_1bc == 0;
    }
    if (bVar1) {
      llvm::Optional<llvm::Triple::EnvironmentType>::operator=(&OStack_798,&local_20c);
    }
  }
  llvm::StringLiteral::StringLiteral<8UL>(&local_818,(char (*) [8])"gnueabi");
  local_268 = local_818.super_StringRef.Data;
  local_260 = (char *)local_818.super_StringRef.Length;
  local_274 = GNUEABI;
  local_270 = &local_7a8;
  bVar1 = llvm::Optional::operator_cast_to_bool((Optional *)&OStack_798);
  if (!bVar1) {
    local_288 = local_268;
    local_280 = local_260;
    local_250 = local_268;
    local_248 = local_260;
    bVar1 = false;
    local_258 = &local_7a8;
    if (local_260 <= local_7a0) {
      local_230 = local_7a8;
      local_238 = local_268;
      local_240 = local_260;
      if (local_260 == (char *)0x0) {
        local_224 = 0;
      }
      else {
        local_224 = memcmp(local_7a8,local_268,(size_t)local_260);
      }
      bVar1 = local_224 == 0;
    }
    if (bVar1) {
      llvm::Optional<llvm::Triple::EnvironmentType>::operator=(&OStack_798,&local_274);
    }
  }
  llvm::StringLiteral::StringLiteral<7UL>(&local_828,(char (*) [7])"gnux32");
  local_2d0 = local_828.super_StringRef.Data;
  local_2c8 = (char *)local_828.super_StringRef.Length;
  local_2dc = GNUX32;
  local_2d8 = &local_7a8;
  bVar1 = llvm::Optional::operator_cast_to_bool((Optional *)&OStack_798);
  if (!bVar1) {
    local_2f0 = local_2d0;
    local_2e8 = local_2c8;
    local_2b8 = local_2d0;
    local_2b0 = local_2c8;
    bVar1 = false;
    local_2c0 = &local_7a8;
    if (local_2c8 <= local_7a0) {
      local_298 = local_7a8;
      local_2a0 = local_2d0;
      local_2a8 = local_2c8;
      if (local_2c8 == (char *)0x0) {
        local_28c = 0;
      }
      else {
        local_28c = memcmp(local_7a8,local_2d0,(size_t)local_2c8);
      }
      bVar1 = local_28c == 0;
    }
    if (bVar1) {
      llvm::Optional<llvm::Triple::EnvironmentType>::operator=(&OStack_798,&local_2dc);
    }
  }
  llvm::StringLiteral::StringLiteral<7UL>(&local_838,(char (*) [7])"code16");
  local_338 = local_838.super_StringRef.Data;
  local_330 = (char *)local_838.super_StringRef.Length;
  local_344 = CODE16;
  local_340 = &local_7a8;
  bVar1 = llvm::Optional::operator_cast_to_bool((Optional *)&OStack_798);
  if (!bVar1) {
    local_358 = local_338;
    local_350 = local_330;
    local_320 = local_338;
    local_318 = local_330;
    bVar1 = false;
    local_328 = &local_7a8;
    if (local_330 <= local_7a0) {
      local_300 = local_7a8;
      local_308 = local_338;
      local_310 = local_330;
      if (local_330 == (char *)0x0) {
        local_2f4 = 0;
      }
      else {
        local_2f4 = memcmp(local_7a8,local_338,(size_t)local_330);
      }
      bVar1 = local_2f4 == 0;
    }
    if (bVar1) {
      llvm::Optional<llvm::Triple::EnvironmentType>::operator=(&OStack_798,&local_344);
    }
  }
  llvm::StringLiteral::StringLiteral<4UL>(&local_848,(char (*) [4])0x364b0f);
  local_3a0 = local_848.super_StringRef.Data;
  local_398 = (char *)local_848.super_StringRef.Length;
  local_3ac = GNU;
  local_3a8 = &local_7a8;
  bVar1 = llvm::Optional::operator_cast_to_bool((Optional *)&OStack_798);
  if (!bVar1) {
    local_3c0 = local_3a0;
    local_3b8 = local_398;
    local_388 = local_3a0;
    local_380 = local_398;
    bVar1 = false;
    local_390 = &local_7a8;
    if (local_398 <= local_7a0) {
      local_368 = local_7a8;
      local_370 = local_3a0;
      local_378 = local_398;
      if (local_398 == (char *)0x0) {
        local_35c = 0;
      }
      else {
        local_35c = memcmp(local_7a8,local_3a0,(size_t)local_398);
      }
      bVar1 = local_35c == 0;
    }
    if (bVar1) {
      llvm::Optional<llvm::Triple::EnvironmentType>::operator=(&OStack_798,&local_3ac);
    }
  }
  llvm::StringLiteral::StringLiteral<8UL>(&local_858,(char (*) [8])"android");
  local_408 = local_858.super_StringRef.Data;
  local_400 = (char *)local_858.super_StringRef.Length;
  local_414 = Android;
  local_410 = &local_7a8;
  bVar1 = llvm::Optional::operator_cast_to_bool((Optional *)&OStack_798);
  if (!bVar1) {
    local_428 = local_408;
    local_420 = local_400;
    local_3f0 = local_408;
    local_3e8 = local_400;
    bVar1 = false;
    local_3f8 = &local_7a8;
    if (local_400 <= local_7a0) {
      local_3d0 = local_7a8;
      local_3d8 = local_408;
      local_3e0 = local_400;
      if (local_400 == (char *)0x0) {
        local_3c4 = 0;
      }
      else {
        local_3c4 = memcmp(local_7a8,local_408,(size_t)local_400);
      }
      bVar1 = local_3c4 == 0;
    }
    if (bVar1) {
      llvm::Optional<llvm::Triple::EnvironmentType>::operator=(&OStack_798,&local_414);
    }
  }
  llvm::StringLiteral::StringLiteral<11UL>(&local_868,(char (*) [11])"musleabihf");
  local_470 = local_868.super_StringRef.Data;
  local_468 = (char *)local_868.super_StringRef.Length;
  local_47c = MuslEABIHF;
  local_478 = &local_7a8;
  bVar1 = llvm::Optional::operator_cast_to_bool((Optional *)&OStack_798);
  if (!bVar1) {
    local_490 = local_470;
    local_488 = local_468;
    local_458 = local_470;
    local_450 = local_468;
    bVar1 = false;
    local_460 = &local_7a8;
    if (local_468 <= local_7a0) {
      local_438 = local_7a8;
      local_440 = local_470;
      local_448 = local_468;
      if (local_468 == (char *)0x0) {
        local_42c = 0;
      }
      else {
        local_42c = memcmp(local_7a8,local_470,(size_t)local_468);
      }
      bVar1 = local_42c == 0;
    }
    if (bVar1) {
      llvm::Optional<llvm::Triple::EnvironmentType>::operator=(&OStack_798,&local_47c);
    }
  }
  llvm::StringLiteral::StringLiteral<9UL>(&local_878,(char (*) [9])"musleabi");
  local_4d8 = local_878.super_StringRef.Data;
  local_4d0 = (char *)local_878.super_StringRef.Length;
  local_4e4 = MuslEABI;
  local_4e0 = &local_7a8;
  bVar1 = llvm::Optional::operator_cast_to_bool((Optional *)&OStack_798);
  if (!bVar1) {
    local_4f8 = local_4d8;
    local_4f0 = local_4d0;
    local_4c0 = local_4d8;
    local_4b8 = local_4d0;
    bVar1 = false;
    local_4c8 = &local_7a8;
    if (local_4d0 <= local_7a0) {
      local_4a0 = local_7a8;
      local_4a8 = local_4d8;
      local_4b0 = local_4d0;
      if (local_4d0 == (char *)0x0) {
        local_494 = 0;
      }
      else {
        local_494 = memcmp(local_7a8,local_4d8,(size_t)local_4d0);
      }
      bVar1 = local_494 == 0;
    }
    if (bVar1) {
      llvm::Optional<llvm::Triple::EnvironmentType>::operator=(&OStack_798,&local_4e4);
    }
  }
  llvm::StringLiteral::StringLiteral<5UL>(&local_888,(char (*) [5])"musl");
  local_540 = local_888.super_StringRef.Data;
  local_538 = (char *)local_888.super_StringRef.Length;
  local_54c = Musl;
  local_548 = &local_7a8;
  bVar1 = llvm::Optional::operator_cast_to_bool((Optional *)&OStack_798);
  if (!bVar1) {
    local_560 = local_540;
    local_558 = local_538;
    local_528 = local_540;
    local_520 = local_538;
    bVar1 = false;
    local_530 = &local_7a8;
    if (local_538 <= local_7a0) {
      local_508 = local_7a8;
      local_510 = local_540;
      local_518 = local_538;
      if (local_538 == (char *)0x0) {
        local_4fc = 0;
      }
      else {
        local_4fc = memcmp(local_7a8,local_540,(size_t)local_538);
      }
      bVar1 = local_4fc == 0;
    }
    if (bVar1) {
      llvm::Optional<llvm::Triple::EnvironmentType>::operator=(&OStack_798,&local_54c);
    }
  }
  llvm::StringLiteral::StringLiteral<5UL>(&local_898,(char (*) [5])"msvc");
  local_5a8 = local_898.super_StringRef.Data;
  local_5a0 = (char *)local_898.super_StringRef.Length;
  local_5b4 = MSVC;
  local_5b0 = &local_7a8;
  bVar1 = llvm::Optional::operator_cast_to_bool((Optional *)&OStack_798);
  if (!bVar1) {
    local_5c8 = local_5a8;
    local_5c0 = local_5a0;
    local_590 = local_5a8;
    local_588 = local_5a0;
    bVar1 = false;
    local_598 = &local_7a8;
    if (local_5a0 <= local_7a0) {
      local_570 = local_7a8;
      local_578 = local_5a8;
      local_580 = local_5a0;
      if (local_5a0 == (char *)0x0) {
        local_564 = 0;
      }
      else {
        local_564 = memcmp(local_7a8,local_5a8,(size_t)local_5a0);
      }
      bVar1 = local_564 == 0;
    }
    if (bVar1) {
      llvm::Optional<llvm::Triple::EnvironmentType>::operator=(&OStack_798,&local_5b4);
    }
  }
  llvm::StringLiteral::StringLiteral<8UL>(&local_8a8,(char (*) [8])"itanium");
  local_610 = local_8a8.super_StringRef.Data;
  local_608 = (char *)local_8a8.super_StringRef.Length;
  local_61c = Itanium;
  local_618 = &local_7a8;
  bVar1 = llvm::Optional::operator_cast_to_bool((Optional *)&OStack_798);
  if (!bVar1) {
    local_630 = local_610;
    local_628 = local_608;
    local_5f8 = local_610;
    local_5f0 = local_608;
    bVar1 = false;
    local_600 = &local_7a8;
    if (local_608 <= local_7a0) {
      local_5d8 = local_7a8;
      local_5e0 = local_610;
      local_5e8 = local_608;
      if (local_608 == (char *)0x0) {
        local_5cc = 0;
      }
      else {
        local_5cc = memcmp(local_7a8,local_610,(size_t)local_608);
      }
      bVar1 = local_5cc == 0;
    }
    if (bVar1) {
      llvm::Optional<llvm::Triple::EnvironmentType>::operator=(&OStack_798,&local_61c);
    }
  }
  llvm::StringLiteral::StringLiteral<7UL>(&local_8b8,(char (*) [7])"cygnus");
  local_678 = local_8b8.super_StringRef.Data;
  local_670 = (char *)local_8b8.super_StringRef.Length;
  local_684 = Cygnus;
  local_680 = &local_7a8;
  bVar1 = llvm::Optional::operator_cast_to_bool((Optional *)&OStack_798);
  if (!bVar1) {
    local_698 = local_678;
    local_690 = local_670;
    local_660 = local_678;
    local_658 = local_670;
    bVar1 = false;
    local_668 = &local_7a8;
    if (local_670 <= local_7a0) {
      local_640 = local_7a8;
      local_648 = local_678;
      local_650 = local_670;
      if (local_670 == (char *)0x0) {
        local_634 = 0;
      }
      else {
        local_634 = memcmp(local_7a8,local_678,(size_t)local_670);
      }
      bVar1 = local_634 == 0;
    }
    if (bVar1) {
      llvm::Optional<llvm::Triple::EnvironmentType>::operator=(&OStack_798,&local_684);
    }
  }
  llvm::StringLiteral::StringLiteral<8UL>(&local_8c8,(char (*) [8])"coreclr");
  local_6e0 = local_8c8.super_StringRef.Data;
  local_6d8 = (char *)local_8c8.super_StringRef.Length;
  local_6ec = CoreCLR;
  local_6e8 = &local_7a8;
  bVar1 = llvm::Optional::operator_cast_to_bool((Optional *)&OStack_798);
  if (!bVar1) {
    local_700 = local_6e0;
    local_6f8 = local_6d8;
    local_6c8 = local_6e0;
    local_6c0 = local_6d8;
    bVar1 = false;
    local_6d0 = &local_7a8;
    if (local_6d8 <= local_7a0) {
      local_6a8 = local_7a8;
      local_6b0 = local_6e0;
      local_6b8 = local_6d8;
      if (local_6d8 == (char *)0x0) {
        local_69c = 0;
      }
      else {
        local_69c = memcmp(local_7a8,local_6e0,(size_t)local_6d8);
      }
      bVar1 = local_69c == 0;
    }
    if (bVar1) {
      llvm::Optional<llvm::Triple::EnvironmentType>::operator=(&OStack_798,&local_6ec);
    }
  }
  llvm::StringLiteral::StringLiteral<10UL>(&local_8d8,(char (*) [10])"simulator");
  local_748 = local_8d8.super_StringRef.Data;
  local_740 = (char *)local_8d8.super_StringRef.Length;
  local_754 = LastEnvironmentType;
  local_750 = &local_7a8;
  bVar1 = llvm::Optional::operator_cast_to_bool((Optional *)&OStack_798);
  if (!bVar1) {
    local_730 = local_748;
    local_728 = local_740;
    bVar1 = false;
    local_738 = &local_7a8;
    if (local_740 <= local_7a0) {
      local_710 = local_7a8;
      local_718 = local_748;
      local_720 = local_740;
      if (local_740 == (char *)0x0) {
        local_704 = 0;
      }
      else {
        local_704 = memcmp(local_7a8,local_748,(size_t)local_740);
      }
      bVar1 = local_704 == 0;
    }
    if (bVar1) {
      llvm::Optional<llvm::Triple::EnvironmentType>::operator=(&OStack_798,&local_754);
    }
  }
  local_1c = UnknownEnvironment;
  local_18 = &local_7a8;
  bVar1 = llvm::Optional::operator_cast_to_bool((Optional *)&OStack_798);
  if (bVar1) {
    pEVar2 = llvm::Optional<llvm::Triple::EnvironmentType>::operator*(&OStack_798);
    local_c = *pEVar2;
  }
  else {
    local_c = local_1c;
  }
  return local_c;
}

Assistant:

static Triple::EnvironmentType parseEnvironment(StringRef EnvironmentName) {
  return StringSwitch<Triple::EnvironmentType>(EnvironmentName)
    .StartsWith("eabihf", Triple::EABIHF)
    .StartsWith("eabi", Triple::EABI)
    .StartsWith("gnuabin32", Triple::GNUABIN32)
    .StartsWith("gnuabi64", Triple::GNUABI64)
    .StartsWith("gnueabihf", Triple::GNUEABIHF)
    .StartsWith("gnueabi", Triple::GNUEABI)
    .StartsWith("gnux32", Triple::GNUX32)
    .StartsWith("code16", Triple::CODE16)
    .StartsWith("gnu", Triple::GNU)
    .StartsWith("android", Triple::Android)
    .StartsWith("musleabihf", Triple::MuslEABIHF)
    .StartsWith("musleabi", Triple::MuslEABI)
    .StartsWith("musl", Triple::Musl)
    .StartsWith("msvc", Triple::MSVC)
    .StartsWith("itanium", Triple::Itanium)
    .StartsWith("cygnus", Triple::Cygnus)
    .StartsWith("coreclr", Triple::CoreCLR)
    .StartsWith("simulator", Triple::Simulator)
    .Default(Triple::UnknownEnvironment);
}